

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.cc
# Opt level: O0

int anon_unknown.dwarf_61d39::connect(int __fd,sockaddr *__addr,socklen_t __len)

{
  ostream *poVar1;
  char *pcVar2;
  runtime_error *prVar3;
  undefined4 in_register_0000003c;
  stringstream ss_2;
  stringstream ss_1;
  int rv;
  stringstream ss;
  int fd;
  undefined8 in_stack_fffffffffffffa48;
  int in_stack_fffffffffffffa50;
  char *in_stack_fffffffffffffa58;
  int in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa68;
  undefined4 in_stack_fffffffffffffa6c;
  void *in_stack_fffffffffffffa70;
  undefined8 in_stack_fffffffffffffa78;
  int in_stack_fffffffffffffa80;
  string local_528 [32];
  stringstream local_508 [16];
  ostream local_4f8 [383];
  undefined1 local_379;
  string local_378 [32];
  stringstream local_358 [16];
  ostream local_348 [376];
  int local_1d0;
  undefined1 local_1c9;
  string local_1c8 [48];
  stringstream local_198 [16];
  ostream local_188 [380];
  int local_c;
  string *local_8;
  
  local_8 = (string *)CONCAT44(in_register_0000003c,__fd);
  local_c = nn_socket(in_stack_fffffffffffffa50,(int)((ulong)in_stack_fffffffffffffa48 >> 0x20));
  if (local_c < 0) {
    std::__cxx11::stringstream::stringstream(local_198);
    poVar1 = std::operator<<(local_188,"nn_socket: ");
    nn_errno();
    pcVar2 = nn_strerror(0);
    std::operator<<(poVar1,pcVar2);
    local_1c9 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1c8);
    local_1c9 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::c_str();
  local_1d0 = nn_connect(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
  if (local_1d0 < 0) {
    nn_close(in_stack_fffffffffffffa60);
    std::__cxx11::stringstream::stringstream(local_358);
    poVar1 = std::operator<<(local_348,"nn_connect: ");
    nn_errno();
    pcVar2 = nn_strerror(0);
    std::operator<<(poVar1,pcVar2);
    poVar1 = std::operator<<(local_348," (");
    poVar1 = std::operator<<(poVar1,local_8);
    std::operator<<(poVar1,")");
    local_379 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar3,local_378);
    local_379 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1d0 = nn_setsockopt(in_stack_fffffffffffffa80,
                            (int)((ulong)in_stack_fffffffffffffa78 >> 0x20),
                            (int)in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,
                            CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
  if (local_1d0 < 0) {
    nn_close(in_stack_fffffffffffffa60);
    std::__cxx11::stringstream::stringstream(local_508);
    poVar1 = std::operator<<(local_4f8,"nn_setsockopt: ");
    nn_errno();
    pcVar2 = nn_strerror(0);
    std::operator<<(poVar1,pcVar2);
    poVar1 = std::operator<<(local_4f8," (");
    poVar1 = std::operator<<(poVar1,local_8);
    std::operator<<(poVar1,")");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar3,local_528);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_c;
}

Assistant:

int connect(const std::string& endpoint) {
  auto fd = nn_socket(AF_SP, NN_SUB);
  if (fd < 0) {
    std::stringstream ss;
    ss << "nn_socket: " << nn_strerror(nn_errno());
    throw std::runtime_error(ss.str());
  }

  auto rv = nn_connect(fd, endpoint.c_str());
  if (rv < 0) {
    nn_close(fd);
    std::stringstream ss;
    ss << "nn_connect: " << nn_strerror(nn_errno());
    ss << " (" << endpoint << ")";
    throw std::runtime_error(ss.str());
  }

  rv = nn_setsockopt(fd, NN_SUB, NN_SUB_SUBSCRIBE, "", 0);
  if (rv < 0) {
    nn_close(fd);
    std::stringstream ss;
    ss << "nn_setsockopt: " << nn_strerror(nn_errno());
    ss << " (" << endpoint << ")";
    throw std::runtime_error(ss.str());
  }

  return fd;
}